

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O1

double bsc_costs_std_root_p_tree_get(bsc_group_t group,bsc_coll_params_t *set,bsc_size_t n)

{
  int iVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (group == (bsc_group_t)0x0) {
    iVar1 = bsp_nprocs();
  }
  else {
    iVar1 = *group;
  }
  dVar3 = (double)iVar1;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar4 = bsc_L(BSC_GET);
  if (0 < n) {
    dVar3 = ceil(dVar3);
    lVar2 = 0;
    do {
      dVar5 = bsc_g(BSC_GET,*(int *)((long)&set->size + lVar2));
      dVar4 = dVar4 + (double)*(int *)((long)&set->size + lVar2) * dVar5 * (double)((int)dVar3 + -1)
      ;
      lVar2 = lVar2 + 0x30;
    } while ((ulong)(uint)n * 0x30 != lVar2);
  }
  return dVar4 + dVar4;
}

Assistant:

double bsc_costs_std_root_p_tree_get(  bsc_group_t group,
         bsc_coll_params_t * set, bsc_size_t n )
{
    bsc_size_t i;
    group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs() ;
    bsc_pid_t root_P = (bsc_pid_t) ceil(sqrt(P));
    double one_phase = bsc_L(BSC_GET); 
    for ( i = 0; i < n ; ++i )
        one_phase += (root_P - 1) * bsc_g(BSC_GET, set[i].size) * set[i].size;

    return 2*one_phase;
}